

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cpp
# Opt level: O0

void Simulator::updateSimSpeed(SimSpeed newSpeed)

{
  SimSpeed in_EDI;
  Color *in_stack_fffffffffffffda8;
  Text *in_stack_fffffffffffffdb0;
  Shape *this;
  char *in_stack_fffffffffffffdb8;
  undefined8 in_stack_fffffffffffffdc8;
  float f;
  locale *in_stack_fffffffffffffdf0;
  locale *this_00;
  string *in_stack_fffffffffffffdf8;
  string *ansiString;
  String *in_stack_fffffffffffffe00;
  String *this_01;
  Color local_1bc;
  locale local_1b8 [44];
  Color local_18c;
  locale local_188 [8];
  string local_180 [32];
  string local_160 [68];
  Color local_11c;
  locale local_118 [8];
  String local_110;
  string local_f0 [68];
  Color local_ac;
  locale local_a8 [8];
  string local_a0 [32];
  string local_80 [64];
  Color local_40 [4];
  locale local_30 [48];
  
  simSpeed = in_EDI;
  if (in_EDI == Paused) {
    std::locale::locale(local_30);
    sf::String::String(in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8,
                       in_stack_fffffffffffffdf0);
    sf::Text::setString(in_stack_fffffffffffffdb0,(String *)in_stack_fffffffffffffda8);
    sf::String::~String((String *)0x15aca5);
    std::locale::~locale(local_30);
    sf::Color::Color(local_40,'\n','\n',0xe6,0xff);
    sf::Shape::setFillColor((Shape *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  }
  else {
    f = (float)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
    if (in_EDI == Slow) {
      decimalToString_abi_cxx11_(f);
      std::operator+(in_stack_fffffffffffffdb8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdb0);
      std::locale::locale(local_a8);
      sf::String::String(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                         in_stack_fffffffffffffdf0);
      sf::Text::setString(in_stack_fffffffffffffdb0,(String *)in_stack_fffffffffffffda8);
      sf::String::~String((String *)0x15adf3);
      std::locale::~locale(local_a8);
      std::__cxx11::string::~string(local_80);
      std::__cxx11::string::~string(local_a0);
      sf::Color::Color(&local_ac,'\n',0xe6,0xe6,0xff);
      sf::Shape::setFillColor((Shape *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    }
    else if (in_EDI == Medium) {
      ansiString = (string *)&(userInterfacePtr->tpsDisplay).text;
      this_01 = &local_110;
      decimalToString_abi_cxx11_(f);
      std::operator+(in_stack_fffffffffffffdb8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdb0);
      this_00 = local_118;
      std::locale::locale(this_00);
      sf::String::String(this_01,ansiString,this_00);
      sf::Text::setString(in_stack_fffffffffffffdb0,(String *)in_stack_fffffffffffffda8);
      sf::String::~String((String *)0x15af85);
      std::locale::~locale(local_118);
      std::__cxx11::string::~string(local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      sf::Color::Color(&local_11c,'\n',0xe6,'\n',0xff);
      sf::Shape::setFillColor((Shape *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    }
    else if (in_EDI == Fast) {
      decimalToString_abi_cxx11_(f);
      std::operator+(in_stack_fffffffffffffdb8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdb0);
      std::locale::locale(local_188);
      sf::String::String(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                         in_stack_fffffffffffffdf0);
      sf::Text::setString(in_stack_fffffffffffffdb0,(String *)in_stack_fffffffffffffda8);
      sf::String::~String((String *)0x15b117);
      std::locale::~locale(local_188);
      std::__cxx11::string::~string(local_160);
      std::__cxx11::string::~string(local_180);
      sf::Color::Color(&local_18c,0xe6,0xe6,'\n',0xff);
      sf::Shape::setFillColor((Shape *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    }
    else {
      std::locale::locale(local_1b8);
      sf::String::String(in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8,
                         in_stack_fffffffffffffdf0);
      sf::Text::setString(in_stack_fffffffffffffdb0,(String *)in_stack_fffffffffffffda8);
      sf::String::~String((String *)0x15b265);
      std::locale::~locale(local_1b8);
      this = &(userInterfacePtr->tpsDisplay).button.super_Shape;
      sf::Color::Color(&local_1bc,0xe6,'\n','\n',0xff);
      sf::Shape::setFillColor(this,in_stack_fffffffffffffda8);
    }
  }
  return;
}

Assistant:

void Simulator::updateSimSpeed(SimSpeed newSpeed) {
    simSpeed = newSpeed;
    if (newSpeed == SimSpeed::Paused) {
        userInterfacePtr->tpsDisplay.text.setString(" Current TPS limit: Paused    ");
        userInterfacePtr->tpsDisplay.button.setFillColor(Color(10, 10, 230));
    } else if (newSpeed == SimSpeed::Slow) {
        userInterfacePtr->tpsDisplay.text.setString(" Current TPS limit: " + decimalToString(config.slowTPSLimit));
        userInterfacePtr->tpsDisplay.button.setFillColor(Color(10, 230, 230));
    } else if (newSpeed == SimSpeed::Medium) {
        userInterfacePtr->tpsDisplay.text.setString(" Current TPS limit: " + decimalToString(config.mediumTPSLimit));
        userInterfacePtr->tpsDisplay.button.setFillColor(Color(10, 230, 10));
    } else if (newSpeed == SimSpeed::Fast) {
        userInterfacePtr->tpsDisplay.text.setString(" Current TPS limit: " + decimalToString(config.fastTPSLimit));
        userInterfacePtr->tpsDisplay.button.setFillColor(Color(230, 230, 10));
    } else {
        userInterfacePtr->tpsDisplay.text.setString(" Current TPS limit: Unlimited ");
        userInterfacePtr->tpsDisplay.button.setFillColor(Color(230, 10, 10));
    }
}